

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<cmCMakePresetsGraph::BuildPreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::
Bind<std::function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::BuildPreset&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraph::BuildPreset> *this,string_view *name,
          function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*)>
          *func,bool required)

{
  Object<cmCMakePresetsGraph::BuildPreset> *pOVar1;
  _Any_data local_40;
  _Manager_type local_30;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*)>
  ::function((function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::BuildPreset_&,_const_Json::Value_*)>
              *)&local_40,func);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_40,required);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }